

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_d1da8e::HandleTarget
               (cmTarget *target,cmMakefile *makefile,string *propertyName,string *propertyValue,
               bool appendAsString,bool appendMode,bool remove)

{
  undefined1 local_58 [45];
  undefined1 local_2b;
  undefined1 local_2a;
  byte local_29;
  bool remove_local;
  bool appendMode_local;
  string *psStack_28;
  bool appendAsString_local;
  string *propertyValue_local;
  string *propertyName_local;
  cmMakefile *makefile_local;
  cmTarget *target_local;
  
  local_2b = remove;
  local_2a = appendMode;
  local_29 = appendAsString;
  psStack_28 = propertyValue;
  propertyValue_local = propertyName;
  propertyName_local = (string *)makefile;
  makefile_local = (cmMakefile *)target;
  if (appendMode) {
    cmMakefile::GetBacktrace((cmMakefile *)local_58);
    std::optional<cmListFileBacktrace>::optional<cmListFileBacktrace,_true>
              ((optional<cmListFileBacktrace> *)(local_58 + 0x10),(cmListFileBacktrace *)local_58);
    cmTarget::AppendProperty
              (target,propertyName,propertyValue,(optional<cmListFileBacktrace> *)(local_58 + 0x10),
               (bool)(local_29 & 1));
    std::optional<cmListFileBacktrace>::~optional
              ((optional<cmListFileBacktrace> *)(local_58 + 0x10));
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_58);
  }
  else if (remove) {
    cmTarget::SetProperty(target,propertyName,(char *)0x0);
  }
  else {
    cmTarget::SetProperty(target,propertyName,propertyValue);
  }
  cmTarget::CheckProperty
            ((cmTarget *)makefile_local,propertyValue_local,(cmMakefile *)propertyName_local);
  return true;
}

Assistant:

bool HandleTarget(cmTarget* target, cmMakefile& makefile,
                  const std::string& propertyName,
                  const std::string& propertyValue, bool appendAsString,
                  bool appendMode, bool remove)
{
  // Set or append the property.
  if (appendMode) {
    target->AppendProperty(propertyName, propertyValue,
                           makefile.GetBacktrace(), appendAsString);
  } else {
    if (remove) {
      target->SetProperty(propertyName, nullptr);
    } else {
      target->SetProperty(propertyName, propertyValue);
    }
  }

  // Check the resulting value.
  target->CheckProperty(propertyName, &makefile);

  return true;
}